

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrinput.cc
# Opt level: O1

void __thiscall ExrInput::~ExrInput(ExrInput *this)

{
  pointer puVar1;
  
  if (((this->image).width != 0) && ((this->image).height != 0)) {
    FreeEXRImage(&this->image);
  }
  FreeEXRHeader(&this->header);
  if (this->err != (char *)0x0) {
    free(this->err);
  }
  puVar1 = (this->exrBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->exrBuffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  ImageInput::~ImageInput(&this->super_ImageInput);
  return;
}

Assistant:

~ExrInput() {
        // FreeEXRVersion(&version); // No need to call, no such function
        if (image.width != 0 && image.height != 0) {
            FreeEXRImage(&image);
        }
        FreeEXRHeader(&header);
        FreeEXRErrorMessage(err);
    }